

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWO2Polygons(LWOImporter *this,uint length)

{
  uint *puVar1;
  uint16_t *puVar2;
  LWOImporter *pLVar3;
  uint uVar4;
  char *message;
  uint16_t *cursor;
  uint iNumVertices;
  uint iNumFaces;
  iterator it;
  uint16_t *local_58;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  uint *local_40;
  undefined8 uStack_38;
  uint local_30;
  
  puVar1 = (uint *)this->mFileBuffer;
  uVar4 = *puVar1;
  this->mFileBuffer = (uint8_t *)(puVar1 + 1);
  uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  pLVar3 = this;
  if ((int)uVar4 < 0x4d42414c) {
    if (uVar4 == 0x424f4e45) goto LAB_0042d46c;
    if (uVar4 == 0x43555256) {
      pLVar3 = (LWOImporter *)DefaultLogger::get();
      message = "LWO2: Encountered unsupported primitive chunk (SPLINE)";
LAB_0042d464:
      Logger::warn((Logger *)pLVar3,message);
      goto LAB_0042d46c;
    }
    if (uVar4 == 0x46414345) goto LAB_0042d46c;
  }
  else {
    if ((uVar4 == 0x53554244) || (uVar4 == 0x50544348)) goto LAB_0042d46c;
    if (uVar4 == 0x4d42414c) {
      pLVar3 = (LWOImporter *)DefaultLogger::get();
      message = "LWO2: Encountered unsupported primitive chunk (METABALL)";
      goto LAB_0042d464;
    }
  }
  pLVar3 = (LWOImporter *)DefaultLogger::get();
  Logger::error((Logger *)pLVar3,"LWO2: Ignoring unknown polygon type.");
LAB_0042d46c:
  puVar2 = (uint16_t *)this->mFileBuffer;
  local_4c = 0;
  local_50 = 0;
  local_58 = puVar2;
  CountVertsAndFacesLWO2
            (pLVar3,&local_50,&local_4c,&local_58,(uint16_t *)((ulong)length + (long)puVar1),
             0xffffffff);
  if ((ulong)local_4c != 0) {
    local_48 = (Face *)((ulong)local_48._4_4_ << 0x20);
    local_40 = (uint *)0x0;
    uStack_38._0_4_ = 0;
    uStack_38._4_4_ = 0;
    local_58 = puVar2;
    local_30 = uVar4;
    std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::resize
              (&this->mCurLayer->mFaces,(ulong)local_4c,(value_type *)&local_48);
    if (local_40 != (uint *)0x0) {
      operator_delete__(local_40);
    }
    local_48 = (this->mCurLayer->mFaces).
               super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
               super__Vector_impl_data._M_start;
    CopyFaceIndicesLWO2(this,(iterator *)&local_48,&local_58,
                        (uint16_t *)((ulong)length + (long)puVar1));
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2Polygons(unsigned int length)
{
    LE_NCONST uint16_t* const end   = (LE_NCONST uint16_t*)(mFileBuffer+length);
    const uint32_t type = GetU4();

    // Determine the type of the polygons
    switch (type)
    {
        // read unsupported stuff too (although we won't process it)
    case  AI_LWO_MBAL:
        ASSIMP_LOG_WARN("LWO2: Encountered unsupported primitive chunk (METABALL)");
        break;
    case  AI_LWO_CURV:
        ASSIMP_LOG_WARN("LWO2: Encountered unsupported primitive chunk (SPLINE)");;
        break;

        // These are ok with no restrictions
    case  AI_LWO_PTCH:
    case  AI_LWO_FACE:
    case  AI_LWO_BONE:
    case  AI_LWO_SUBD:
        break;
    default:

        // hm!? wtf is this? ok ...
        ASSIMP_LOG_ERROR("LWO2: Ignoring unknown polygon type.");
        break;
    }

    // first find out how many faces and vertices we'll finally need
    uint16_t* cursor= (uint16_t*)mFileBuffer;

    unsigned int iNumFaces = 0,iNumVertices = 0;
    CountVertsAndFacesLWO2(iNumVertices,iNumFaces,cursor,end);

    // allocate the output array and copy face indices
    if (iNumFaces)
    {
        cursor = (uint16_t*)mFileBuffer;

        mCurLayer->mFaces.resize(iNumFaces,LWO::Face(type));
        FaceList::iterator it = mCurLayer->mFaces.begin();
        CopyFaceIndicesLWO2(it,cursor,end);
    }
}